

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void do_gop(void *x,int n,char *op,int type,ARMCI_Group group)

{
  char cVar1;
  bool bVar2;
  void *__dest;
  int iVar3;
  ARMCI_Group group_00;
  void *pvVar4;
  undefined4 in_register_0000000c;
  char *op_00;
  int n_00;
  ARMCI_Group AVar5;
  MPI_Comm poVar6;
  undefined *puVar7;
  bool bVar8;
  int mpi_type_size;
  ARMCI_Group group_local;
  void *local_48;
  undefined *local_40;
  MPI_Comm local_38;
  
  op_00 = (char *)CONCAT44(in_register_0000000c,type);
  mpi_type_size = 0;
  AVar5 = group;
  group_local = group;
  local_48 = x;
  if (group == -2) {
    poVar6 = (MPI_Comm)&ompi_mpi_comm_self;
  }
  else {
    poVar6 = get_comm(&group_local);
  }
  if (type == -0x133) {
    local_40 = &ompi_mpi_double;
  }
  else if (type == -0x132) {
    local_40 = &ompi_mpi_float;
  }
  else if (type == -0x66) {
    local_40 = &ompi_mpi_long_long_int;
  }
  else if (type == -99) {
    local_40 = &ompi_mpi_int;
  }
  else {
    if (type != -0x65) {
      iVar3 = 0x1b1508;
      pvVar4 = (void *)(ulong)(uint)type;
      comex_error("armci_type_to_mpi_type: unrecognized type",type);
      if (iVar3 == 0x151) {
        group_00 = ARMCI_Node_group;
        if (_number_of_procs_per_node < 2) {
          group_00 = -2;
        }
      }
      else {
        group_00 = get_default_group();
      }
      do_gop(pvVar4,n_00,op_00,AVar5,group_00);
      return;
    }
    local_40 = &ompi_mpi_long;
  }
  MPI_Type_size(local_40,&mpi_type_size);
  cVar1 = *op;
  local_38 = poVar6;
  if (cVar1 == '*') {
    puVar7 = &ompi_mpi_op_prod;
    goto LAB_0015916f;
  }
  if (cVar1 == '+') {
    puVar7 = &ompi_mpi_op_sum;
    goto LAB_0015916f;
  }
  if (cVar1 == 'm') {
    if (op[1] != 'i') {
      if ((op[1] != 'a') || (op[2] != 'x')) goto LAB_00159034;
LAB_00159089:
      puVar7 = &ompi_mpi_op_max;
      goto LAB_0015916f;
    }
    if (op[2] != 'n') goto LAB_00159034;
  }
  else {
LAB_00159034:
    iVar3 = strncmp(op,"absmin",6);
    if (iVar3 != 0) {
      iVar3 = strncmp(op,"absmax",6);
      if (iVar3 == 0) goto LAB_00159089;
      if (cVar1 == '&') {
        bVar2 = true;
        if (op[1] != '&') goto LAB_001590a2;
LAB_001590d4:
        puVar7 = &ompi_mpi_op_land;
        goto LAB_0015916f;
      }
      if ((cVar1 != 'o') || (op[1] != 'r')) {
        bVar2 = false;
LAB_001590a2:
        iVar3 = strncmp(op,"land",4);
        if (iVar3 == 0) goto LAB_001590d4;
        if (cVar1 == '|') {
          bVar8 = op[1] == '|';
LAB_001590c6:
          if (bVar8) {
            puVar7 = &ompi_mpi_op_lor;
          }
          else {
            puVar7 = &ompi_mpi_op_band;
          }
          if (bVar2 || bVar8) goto LAB_0015916f;
        }
        else {
          if ((cVar1 == 'l') && (op[1] == 'o')) {
            bVar8 = op[2] == 'r';
            goto LAB_001590c6;
          }
          if (bVar2) {
            puVar7 = &ompi_mpi_op_band;
            goto LAB_0015916f;
          }
        }
        iVar3 = strncmp(op,"band",4);
        if (iVar3 != 0) {
          puVar7 = &ompi_mpi_op_bor;
        }
        else {
          puVar7 = &ompi_mpi_op_band;
        }
        if (cVar1 == '|' || iVar3 == 0) goto LAB_0015916f;
        if (((cVar1 != 'b') || (op[1] != 'o')) || (op[2] != 'r')) {
          comex_error("Unsupported gop operation",1);
          goto LAB_0015916f;
        }
      }
      puVar7 = &ompi_mpi_op_bor;
      goto LAB_0015916f;
    }
  }
  puVar7 = &ompi_mpi_op_min;
LAB_0015916f:
  iVar3 = strncmp(op,"absmin",6);
  if ((iVar3 == 0) || (iVar3 = strncmp(op,"absmax",6), iVar3 == 0)) {
    do_abs(local_48,n,type);
  }
  pvVar4 = malloc((long)mpi_type_size * (long)n);
  if (pvVar4 == (void *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xd7,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  if (group != -2) {
    comex_barrier(group);
  }
  __dest = local_48;
  iVar3 = MPI_Allreduce(local_48,pvVar4,n,local_40,puVar7,local_38);
  if (iVar3 != 0) {
    __assert_fail("rc == MPI_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0xdd,"void do_gop(void *, int, char *, int, ARMCI_Group)");
  }
  memcpy(__dest,pvVar4,(long)mpi_type_size * (long)n);
  free(pvVar4);
  return;
}

Assistant:

static void do_gop(void *x, int n, char* op, int type, ARMCI_Group group)
{
    MPI_Comm comm = MPI_COMM_NULL;
    int mpi_type_size = 0;
    MPI_Datatype mpi_type = MPI_DATATYPE_NULL;
    int rc = 0;
    void *result = NULL;
    MPI_Op mpi_op = MPI_OP_NULL;

    if (ARMCI_GROUP_SELF == group) {
        comm = MPI_COMM_SELF;
    }
    else {
        comm = get_comm(&group);
    }
    mpi_type = armci_type_to_mpi_type(type);
    MPI_Type_size(mpi_type, &mpi_type_size);
    mpi_op = armci_op_to_mpi_op(op);

    if (strncmp(op, "absmin", 6) == 0) {
        do_abs(x, n, type);
    }
    else if (strncmp(op, "absmax", 6) == 0) {
        do_abs(x, n, type);
    }
        
    result = malloc(n*mpi_type_size);
    assert(result);

    if (ARMCI_GROUP_SELF != group) {
        comex_barrier(group);
    }
    rc = MPI_Allreduce(x, result, n, mpi_type, mpi_op, comm); 
    assert(rc == MPI_SUCCESS);

    memcpy(x, result, mpi_type_size * n);
    free(result);
}